

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_1c19eb::SerialQueueImpl::run(SerialQueueImpl *this)

{
  function<void_()> *__x;
  function<void_()> fn;
  unique_lock<std::mutex> lock;
  
  while( true ) {
    fn.super__Function_base._M_manager = (_Manager_type)0x0;
    fn._M_invoker = (_Invoker_type)0x0;
    fn.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    fn.super__Function_base._M_functor._8_8_ = 0;
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->operationsMutex);
    while (__x = (this->operations).
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur,
          (this->operations).
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == __x) {
      std::condition_variable::wait((unique_lock *)&this->readyOperationsCondition);
    }
    std::function<void_()>::operator=(&fn,__x);
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&this->operations);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    if (fn.super__Function_base._M_manager == (_Manager_type)0x0) break;
    std::function<void_()>::operator()(&fn);
    if (fn.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*fn.super__Function_base._M_manager)((_Any_data *)&fn,(_Any_data *)&fn,__destroy_functor);
    }
  }
  return;
}

Assistant:

void run() {
    while (true) {
      // Get the next operation from the queue.
      std::function<void(void)> fn;
      {
        std::unique_lock<std::mutex> lock(operationsMutex);

        // While the queue is empty, wait for an item.
        while (operations.empty()) {
          readyOperationsCondition.wait(lock);
        }

        fn = operations.front();
        operations.pop_front();
      }

      // If we got a nil function, the queue is shutting down.
      if (!fn)
        break;
      
      // Execute the operation.
      fn();
    }
  }